

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

int __thiscall
CTcTokenizer::pp_parse_expr
          (CTcTokenizer *this,CTcConstVal *val,int read_first,int last_on_line,int add_line_ending)

{
  tc_toktyp_t tVar1;
  int iVar2;
  CTcPrsNode *pCVar3;
  CTcTokString *this_00;
  size_t sVar4;
  undefined4 extraout_var;
  int in_ECX;
  int in_EDX;
  void *in_RSI;
  byte *in_RDI;
  int in_R8D;
  char ch;
  CTcPrsNode *expr_tree;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  CTcTokString *in_stack_ffffffffffffffd0;
  int local_4;
  
  if (in_R8D != 0) {
    in_stack_ffffffffffffffcf = 4;
    CTcTokString::append
              (in_stack_ffffffffffffffd0,(char *)CONCAT17(4,in_stack_ffffffffffffffc8),
               (size_t)in_RDI);
  }
  *in_RDI = *in_RDI & 0xdf | 0x20;
  CTcParser::set_pp_expr_mode(G_prs,1);
  if (in_EDX != 0) {
    next((CTcTokenizer *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  }
  pCVar3 = CTcParser::parse_expr((CTcParser *)0x29b2af);
  if (in_ECX != 0) {
    tVar1 = next((CTcTokenizer *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    if (tVar1 != TOKT_EOF) {
      log_error(0x2727);
    }
  }
  if (in_R8D != 0) {
    this_00 = (CTcTokString *)(in_RDI + 0xe0);
    sVar4 = CTcTokString::get_text_len((CTcTokString *)(in_RDI + 0xe0));
    CTcTokString::set_text_len(this_00,sVar4 - 1);
  }
  CTcParser::set_pp_expr_mode(G_prs,0);
  *in_RDI = *in_RDI & 0xdf;
  if (pCVar3 == (CTcPrsNode *)0x0) {
    local_4 = 1;
  }
  else {
    iVar2 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x29b347);
    if (iVar2 == 0) {
      log_error(0x2747);
      local_4 = 1;
    }
    else {
      iVar2 = (*(pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
      memcpy(in_RSI,(void *)CONCAT44(extraout_var,iVar2),0x21);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int CTcTokenizer::pp_parse_expr(CTcConstVal *val, int read_first,
                                int last_on_line, int add_line_ending)
{
    CTcPrsNode *expr_tree;
    char ch;
    
    /* add the line ending marker if required */
    if (add_line_ending)
    {
        /* 
         *   append the special end-of-preprocess-line to the macro
         *   expansion buffer 
         */
        ch = TOK_END_PP_LINE;
        expbuf_.append(&ch, 1);
    }

    /* 
     *   note that we're pasing a preprocessor expression; this affects
     *   error logging in certain cases 
     */
    in_pp_expr_ = TRUE;

    /* 
     *   parse the expression in preprocessor mode, so that double-quoted
     *   strings can be concatenated and compared 
     */
    G_prs->set_pp_expr_mode(TRUE);

    /* get the first token on the line if desired */
    if (read_first)
        next();

    /* parse the expression */
    expr_tree = G_prs->parse_expr();

    /* make sure we're at the end of the line if desired */
    if (last_on_line && next() != TOKT_EOF)
        log_error(TCERR_PP_EXPR_EXTRA);

    /* if we added the special pp-line-ending marker, remove it */
    if (add_line_ending)
    {
        /* 
         *   the marker is always the last character - remove it simply by
         *   shortening the buffer by a character 
         */
        expbuf_.set_text_len(expbuf_.get_text_len() - 1);
    }

    /* return to normal expression mode */
    G_prs->set_pp_expr_mode(FALSE);

    /* return to normal tokenizing mode */
    in_pp_expr_ = FALSE;

    /* if we didn't get a valid expression, return failure */
    if (expr_tree == 0)
        return 1;

    /* make sure we got a constant */
    if (!expr_tree->is_const())
    {
        log_error(TCERR_PP_EXPR_NOT_CONST);
        return 1;
    }

    /* fill in the caller's value */
    *val = *expr_tree->get_const_val();

    /* success */
    return 0;
}